

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fft.c
# Opt level: O0

int WebRtcSpl_RealForwardFFT(RealFFT *self,int16_t *real_data_in,int16_t *complex_data_out)

{
  int iVar1;
  int iVar2;
  int16_t local_1038 [4];
  int16_t complex_buffer [2048];
  int n;
  int result;
  int j;
  int i;
  int16_t *complex_data_out_local;
  int16_t *real_data_in_local;
  RealFFT *self_local;
  
  iVar1 = 1 << ((byte)self->order & 0x1f);
  n = 0;
  for (result = 0; result < iVar1; result = result + 1) {
    local_1038[n] = real_data_in[result];
    local_1038[n + 1] = 0;
    n = n + 2;
  }
  WebRtcSpl_ComplexBitReverse(local_1038,self->order);
  iVar2 = WebRtcSpl_ComplexFFT(local_1038,self->order,1);
  memcpy(complex_data_out,local_1038,(long)(iVar1 + 2) << 1);
  return iVar2;
}

Assistant:

int WebRtcSpl_RealForwardFFT(struct RealFFT* self,
                             const int16_t* real_data_in,
                             int16_t* complex_data_out) {
  int i = 0;
  int j = 0;
  int result = 0;
  int n = 1 << self->order;
  // The complex-value FFT implementation needs a buffer to hold 2^order
  // 16-bit COMPLEX numbers, for both time and frequency data.
  int16_t complex_buffer[2 << kMaxFFTOrder];

  // Insert zeros to the imaginary parts for complex forward FFT input.
  for (i = 0, j = 0; i < n; i += 1, j += 2) {
    complex_buffer[j] = real_data_in[i];
    complex_buffer[j + 1] = 0;
  };

  WebRtcSpl_ComplexBitReverse(complex_buffer, self->order);
  result = WebRtcSpl_ComplexFFT(complex_buffer, self->order, 1);

  // For real FFT output, use only the first N + 2 elements from
  // complex forward FFT.
  memcpy(complex_data_out, complex_buffer, sizeof(int16_t) * (n + 2));

  return result;
}